

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteName(WatWriter *this,string_view str,NextChar next_char)

{
  undefined1 *src;
  size_t size;
  byte *pbVar1;
  ulong size_00;
  byte *pbVar2;
  ulong uVar3;
  byte *src_00;
  long lVar4;
  string valid_str;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  size_00 = str.size_;
  src_00 = (byte *)str.data_;
  if ((size_00 == 0) || (*src_00 != 0x24)) {
    __assert_fail("!str.empty() && str.front() == \'$\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wat-writer.cc"
                  ,0x135,
                  "void wabt::(anonymous namespace)::WatWriter::WriteName(string_view, NextChar)");
  }
  pbVar1 = src_00;
  if (0 < (long)size_00 >> 2) {
    pbVar1 = src_00 + (size_00 & 0xfffffffffffffffc);
    lVar4 = ((long)size_00 >> 2) + 1;
    pbVar2 = src_00 + 3;
    do {
      if ((anonymous_namespace)::s_valid_name_chars[pbVar2[-3]] == '\0') {
        pbVar2 = pbVar2 + -3;
        goto LAB_00158b8e;
      }
      if ((anonymous_namespace)::s_valid_name_chars[pbVar2[-2]] == '\0') {
        pbVar2 = pbVar2 + -2;
        goto LAB_00158b8e;
      }
      if ((anonymous_namespace)::s_valid_name_chars[pbVar2[-1]] == '\0') {
        pbVar2 = pbVar2 + -1;
        goto LAB_00158b8e;
      }
      if ((anonymous_namespace)::s_valid_name_chars[*pbVar2] == '\0') goto LAB_00158b8e;
      lVar4 = lVar4 + -1;
      pbVar2 = pbVar2 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)(src_00 + size_00) - (long)pbVar1;
  if (lVar4 == 1) {
LAB_00158b61:
    pbVar2 = pbVar1;
    if ((anonymous_namespace)::s_valid_name_chars[*pbVar1] == '\0') goto LAB_00158b8e;
  }
  else {
    if (lVar4 == 2) {
LAB_00158b4e:
      pbVar2 = pbVar1;
      if ((anonymous_namespace)::s_valid_name_chars[*pbVar1] != '\0') {
        pbVar1 = pbVar1 + 1;
        goto LAB_00158b61;
      }
    }
    else {
      if (lVar4 != 3) goto LAB_00158c22;
      pbVar2 = pbVar1;
      if ((anonymous_namespace)::s_valid_name_chars[*pbVar1] != '\0') {
        pbVar1 = pbVar1 + 1;
        goto LAB_00158b4e;
      }
    }
LAB_00158b8e:
    if (pbVar2 != src_00 + size_00) {
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      uVar3 = 0;
      do {
        std::__cxx11::string::push_back((char)&local_50);
        size = local_48;
        src = local_50;
        uVar3 = uVar3 + 1;
      } while (size_00 != uVar3);
      WriteNextChar(this);
      Stream::WriteData(this->stream_,src,size,(char *)0x0,No);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      goto LAB_00158c3e;
    }
  }
LAB_00158c22:
  WriteNextChar(this);
  Stream::WriteData(this->stream_,src_00,size_00,(char *)0x0,No);
LAB_00158c3e:
  this->next_char_ = next_char;
  return;
}

Assistant:

void WatWriter::WriteCloseSpace() {
  WriteClose(NextChar::Space);
}